

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Vec3fa embree::MirrorMaterial__sample
                 (ISPCMirrorMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,DifferentialGeometry *dg
                 ,Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RSI;
  undefined8 *in_RDI;
  Vec3fa *in_R8;
  long in_R9;
  Vec3fa VVar4;
  Sample3f *in_stack_00000008;
  Vec3fa *in_stack_ffffffffffffff88;
  Sample3f local_68 [2];
  long local_20;
  undefined8 uVar3;
  
  local_20 = in_RSI;
  VVar4 = reflect((embree *)&stack0xffffffffffffff88,in_R8,(Vec3fa *)(in_R9 + 0x40));
  uVar3 = VVar4.field_0._8_8_;
  make_Sample3f(in_stack_ffffffffffffff88,(float)((ulong)in_RDI >> 0x20));
  Sample3f::operator=(in_stack_00000008,local_68);
  uVar1 = *(undefined8 *)(local_20 + 0x10);
  uVar2 = *(undefined8 *)(local_20 + 0x18);
  *in_RDI = uVar1;
  in_RDI[1] = uVar2;
  VVar4.field_0._8_8_ = uVar3;
  VVar4.field_0._0_8_ = uVar1;
  return (Vec3fa)VVar4.field_0;
}

Assistant:

Vec3fa MirrorMaterial__sample(ISPCMirrorMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  wi_o = make_Sample3f(reflect(wo,dg.Ns),1.0f);
  return Vec3fa(This->reflectance);
}